

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O3

string * __thiscall
cmQtAutoGeneratorMocUic::MocSettingsT::MacrosString_abi_cxx11_
          (string *__return_storage_ptr__,MocSettingsT *this)

{
  pointer pKVar1;
  pointer pKVar2;
  long lVar3;
  long lVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pKVar1 = (this->MacroFilters).
           super__Vector_base<cmQtAutoGeneratorMocUic::KeyExpT,_std::allocator<cmQtAutoGeneratorMocUic::KeyExpT>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->MacroFilters).
           super__Vector_base<cmQtAutoGeneratorMocUic::KeyExpT,_std::allocator<cmQtAutoGeneratorMocUic::KeyExpT>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar1 != pKVar2) {
    lVar4 = 0;
    do {
      if (lVar4 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,
                 *(ulong *)((long)(pKVar1->Exp).regmatch.startp + lVar4 + -0x20));
      lVar3 = lVar4 + -0x20;
      lVar4 = lVar4 + 0xf0;
    } while ((pointer)((long)pKVar1[1].Exp.regmatch.startp + lVar3) != pKVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGeneratorMocUic::MocSettingsT::MacrosString() const
{
  std::string res;
  const auto itB = MacroFilters.cbegin();
  const auto itE = MacroFilters.cend();
  const auto itL = itE - 1;
  auto itC = itB;
  for (; itC != itE; ++itC) {
    // Separator
    if (itC != itB) {
      if (itC != itL) {
        res += ", ";
      } else {
        res += " or ";
      }
    }
    // Key
    res += itC->Key;
  }
  return res;
}